

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_gmsh.cpp
# Opt level: O2

Omega_h_Family Omega_h::gmsh::anon_unknown_0::type_family(Int type)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = type - 1;
  if ((uVar1 < 0xf) && (in_RAX = 0x401f, (0x401fU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(Omega_h_Family *)(&DAT_0037dd04 + (ulong)uVar1 * 4);
  }
  fail("assertion %s failed at %s +%d\n","false",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_gmsh.cpp"
       ,0x40,in_R8,in_R9,in_RAX);
}

Assistant:

Omega_h_Family type_family(Int type) {
  switch (type) {
    case GMSH_VERT:
    case GMSH_LINE:
    case GMSH_TRI:
    case GMSH_TET:
      return OMEGA_H_SIMPLEX;
    case GMSH_QUAD:
    case GMSH_HEX:
      return OMEGA_H_HYPERCUBE;
  }
  OMEGA_H_NORETURN(Omega_h_Family());
}